

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu.cpp
# Opt level: O3

int __thiscall ncnn::ELU::forward_inplace(ELU *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    pvVar5 = bottom_top_blob->data;
    lVar4 = 0;
    do {
      if (0 < (int)uVar7) {
        uVar6 = 0;
        do {
          fVar8 = *(float *)((long)pvVar5 + uVar6 * 4);
          if (fVar8 < 0.0) {
            fVar8 = expf(fVar8);
            *(float *)((long)pvVar5 + uVar6 * 4) = (fVar8 + -1.0) * this->alpha;
          }
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      lVar4 = lVar4 + 1;
      pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
    } while (lVar4 != iVar1);
  }
  return 0;
}

Assistant:

int ELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = static_cast<float>(alpha * (exp(ptr[i]) - 1.f));
        }
    }

    return 0;
}